

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O0

void checkmatch(int blocktype)

{
  undefined4 in_EAX;
  int in_EDI;
  undefined4 unaff_retaddr;
  char *s2;
  
  s2 = (char *)CONCAT44(in_EDI,in_EAX);
  if (in_EDI != 0x10a) {
    diag((char *)CONCAT44(blocktype,unaff_retaddr),s2);
  }
  matchused = 1;
  if ((match_bound != (List *)0x0) || (match_init != (List *)0x0)) {
    diag((char *)CONCAT44(blocktype,unaff_retaddr),s2);
  }
  if (indepsym == (Symbol *)0x0) {
    diag((char *)CONCAT44(blocktype,unaff_retaddr),s2);
  }
  match_bound = newlist();
  match_init = newlist();
  return;
}

Assistant:

void checkmatch(blocktype) int blocktype; {
	if (blocktype != DERIVATIVE) {
		diag("MATCH block can only be in DERIVATIVE block", (char *)0);
	}
	matchused = 1; /*communicate with massagederiv*/
	if (match_bound || match_init) {
		diag("Only one MATCH block allowed", (char *)0);
	}
	if (!indepsym) {
		diag("INDEPENDENT variable must be declared before MATCH",
		 " statement");
	}
	match_bound = newlist();
	match_init = newlist();
}